

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

Gia_Man_t *
Gia_ManSweepWithBoxesAndDomains
          (Gia_Man_t *p,void *pParsS,int fConst,int fEquiv,int fVerbose,int fVerbEquivs)

{
  uint *puVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  long lVar3;
  Gia_Man_t *pGVar4;
  int *pReprs;
  Gia_Man_t *p_01;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  int pFlopTypes [3];
  undefined8 local_68;
  uint local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  Gia_Man_t *local_48;
  void *local_40;
  ulong local_38;
  
  uVar11 = p->vRegClasses->nSize;
  if ((ulong)uVar11 == 0) {
    uVar9 = 0;
  }
  else {
    puVar1 = (uint *)p->vRegClasses->pArray;
    uVar9 = *puVar1;
    if (1 < (int)uVar11) {
      uVar6 = 1;
      do {
        uVar10 = puVar1[uVar6];
        if ((int)uVar9 <= (int)uVar10) {
          uVar9 = uVar10;
        }
        uVar6 = uVar6 + 1;
      } while (uVar11 != uVar6);
    }
  }
  local_60 = 0;
  local_68 = 0;
  local_58 = fConst;
  local_54 = fEquiv;
  local_50 = fVerbose;
  local_4c = fVerbEquivs;
  local_40 = pParsS;
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x28b,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x28c,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  if ((int)uVar9 < 2) {
    __assert_fail("nDoms > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x28d,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  p_00 = Gia_ManDupUnnormalize(p);
  pGVar4 = (Gia_Man_t *)0x0;
  if (p_00 != (Gia_Man_t *)0x0) {
    local_48 = p;
    Gia_ManTransferTiming(p_00,p);
    uVar11 = 1;
    do {
      lVar3 = (long)p_00->vRegClasses->nSize;
      if (0 < lVar3) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          uVar10 = (int)uVar6 + (uint)(p_00->vRegClasses->pArray[lVar7] == uVar11);
          uVar6 = (ulong)uVar10;
          lVar7 = lVar7 + 1;
        } while (lVar3 != lVar7);
        if (1 < uVar10) {
          pGVar4 = Gia_ManDupCollapse(p_00,p_00->pAigExtra,(Vec_Int_t *)0x0,1);
          iVar5 = local_50;
          Gia_ManSweepComputeOneDomainEquivs
                    (pGVar4,p_00->vRegClasses,uVar11,local_40,local_58,local_54,local_50);
          pReprs = Gia_ManFraigSelectReprs(p_00,pGVar4,iVar5,(int *)&local_68);
          Gia_ManStop(pGVar4);
          pGVar4 = local_48;
          Gia_ManTransferTiming(local_48,p_00);
          p_01 = Gia_ManFraigReduceGia(p_00,pReprs);
          Gia_ManTransferTiming(p_01,pGVar4);
          Gia_ManStop(p_00);
          if (pReprs != (int *)0x0) {
            free(pReprs);
          }
          p_00 = Gia_ManDupWithBoxes(p_01,1);
          Gia_ManStop(p_01);
          lVar3 = (long)p_00->vRegClasses->nSize;
          if (lVar3 < 1) {
            iVar5 = 0;
          }
          else {
            lVar7 = 0;
            iVar5 = 0;
            do {
              iVar5 = iVar5 + (uint)(p_00->vRegClasses->pArray[lVar7] == uVar11);
              lVar7 = lVar7 + 1;
            } while (lVar3 != lVar7);
          }
          uVar8 = (ulong)local_68._4_4_;
          uVar10 = uVar10 - ((int)local_68 + local_68._4_4_ + iVar5);
          local_60 = uVar10;
          if (local_4c != 0) {
            local_38 = local_68 & 0xffffffff;
            printf("Domain %2d : %5d -> %5d :  ",(ulong)uVar11,uVar6);
            uVar6 = 0;
            if (0 < (int)uVar10) {
              uVar6 = (ulong)uVar10;
            }
            uVar2 = -uVar10;
            if (-1 < (int)uVar10) {
              uVar2 = 0;
            }
            printf("EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n",local_38,uVar8,
                   uVar6,(ulong)uVar2);
          }
        }
      }
      bVar12 = uVar11 != uVar9;
      uVar11 = uVar11 + 1;
    } while (bVar12);
    pGVar4 = Gia_ManDupNormalize(p_00);
    Gia_ManTransferTiming(pGVar4,p_00);
    Gia_ManStop(p_00);
  }
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManSweepWithBoxesAndDomains( Gia_Man_t * p, void * pParsS, int fConst, int fEquiv, int fVerbose, int fVerbEquivs )
{ 
    Gia_Man_t * pClp, * pNew, * pTemp;
    int nDoms = Vec_IntFindMax(p->vRegClasses);
    int * pReprs, iDom, pFlopTypes[3] = {0};
    assert( Gia_ManRegNum(p) == 0 );
    assert( p->pAigExtra != NULL );
    assert( nDoms > 1 );
    // order AIG objects
    pNew = Gia_ManDupUnnormalize( p );
    if ( pNew == NULL )
        return NULL;
    Gia_ManTransferTiming( pNew, p );
    // iterate over domains
    for ( iDom = 1; iDom <= nDoms; iDom++ )
    {
        int nFlopsNew, nFlops = Vec_IntCountEntry(pNew->vRegClasses, iDom);
        if ( nFlops < 2 )
            continue;
        // find global equivalences
        pClp = Gia_ManDupCollapse( pNew, pNew->pAigExtra, NULL, 1 );
        // compute equivalences
        Gia_ManSweepComputeOneDomainEquivs( pClp, pNew->vRegClasses, iDom, pParsS, fConst, fEquiv, fVerbose );
        // transfer equivalences
        pReprs = Gia_ManFraigSelectReprs( pNew, pClp, fVerbose, pFlopTypes );
        Gia_ManStop( pClp );
        // reduce AIG
        Gia_ManTransferTiming( p, pNew );
        pNew = Gia_ManFraigReduceGia( pTemp = pNew, pReprs );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( pTemp );
        ABC_FREE( pReprs );
        // derive new AIG
        pNew = Gia_ManDupWithBoxes( pTemp = pNew, 1 );
        Gia_ManStop( pTemp );
        // report
        nFlopsNew = Vec_IntCountEntry(pNew->vRegClasses, iDom);
        pFlopTypes[2] = nFlops - nFlopsNew - (pFlopTypes[0] + pFlopTypes[1]);
        if ( fVerbEquivs )
        {
            printf( "Domain %2d : %5d -> %5d :  ", iDom, nFlops, nFlopsNew );
            printf( "EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n", 
                pFlopTypes[0], pFlopTypes[1], Abc_MaxInt(0, pFlopTypes[2]), Abc_MaxInt(0, -pFlopTypes[2]) );
            //Gia_ManPrintStats( pNew, NULL );
        }
    }
    // normalize the result
    pNew = Gia_ManDupNormalize( pTemp = pNew );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManStop( pTemp );
    // check integrity
    //Gia_ManCheckIntegrityWithBoxes( pNew );
    return pNew;
}